

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeBee.cpp
# Opt level: O3

int TeeBee::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  Data *data;
  int iVar1;
  
  data = (Data *)(state->field_0).field_0.effectdata;
  if (data == (Data *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = TeeBee::EffectData]");
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    iVar1 = 1;
    if (index < 0x11) {
      data->p[index] = value;
      iVar1 = 0;
      if ((uint)index < 3) {
        CalcPattern(data);
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = TeeBee::EffectData]");
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_SEED || index == P_MINNOTE || index == P_MAXNOTE)
            CalcPattern(data);
        return UNITY_AUDIODSP_OK;
    }